

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteFromAcceptList(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint16_t port;
  AddressType AVar1;
  uint32_t ip;
  RTPIPv4Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv4Address) {
      if (this->receivemode == AcceptSome) {
        ip = RTPIPv4Address::GetIP((RTPIPv4Address *)addr);
        port = RTPIPv4Address::GetPort((RTPIPv4Address *)addr);
        this_local._4_4_ = ProcessDeleteAcceptIgnoreEntry(this,ip,port);
      }
      else {
        this_local._4_4_ = -0x52;
      }
    }
    else {
      this_local._4_4_ = -0x54;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::DeleteFromAcceptList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::AcceptSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	status = ProcessDeleteAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}